

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void write_num_bytes(CVmDataSource *dst,char *buf,CVmPackType *t,size_t len)

{
  int iVar1;
  ulong in_RCX;
  long in_RDX;
  char *in_RSI;
  long *in_RDI;
  
  if ((1 < in_RCX) && (*(int *)(in_RDX + 0x20) != 0)) {
    reverse_bytes(in_RSI,in_RCX);
  }
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,in_RCX);
  if (iVar1 != 0) {
    err_throw(0);
  }
  return;
}

Assistant:

static void write_num_bytes(class CVmDataSource *dst,
                            char *buf, const CVmPackType *t, size_t len)
{
    /* 
     *   we always prepare our buffers in our standard little-endian byte
     *   order, so if the type has a big-endian flag, we need to reverse the
     *   byte order
     */
    if (len > 1 && t->big_endian)
        reverse_bytes(buf, len);

    /* write the bytes */
    if (dst->write(buf, len))
        err_throw(VMERR_WRITE_FILE);
}